

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O2

VkSamplerCreateInfo *
vk::mapSampler(VkSamplerCreateInfo *__return_storage_ptr__,Sampler *sampler,TextureFormat *format,
              float minLod,float maxLod)

{
  CompareMode mode;
  FilterMode FVar1;
  bool bVar2;
  VkCompareOp VVar3;
  TextureChannelClass TVar4;
  VkFilter VVar5;
  VkSamplerAddressMode VVar6;
  uint uVar7;
  VkFilter VVar8;
  VkBorderColor VVar9;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  CompareMode local_3c;
  float local_38;
  float local_34;
  
  mode = sampler->compare;
  local_38 = minLod;
  local_34 = maxLod;
  if (mode == COMPAREMODE_NONE) {
    VVar3 = VK_COMPARE_OP_ALWAYS;
  }
  else {
    VVar3 = mapCompareMode(mode);
  }
  TVar4 = tcu::getTextureChannelClass(format->type);
  local_3c = mode;
  if (TVar4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_58.m_data._0_8_ = *(undefined8 *)&(sampler->borderColor).v;
    local_58.m_data._8_8_ = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.0;
    bVar2 = tcu::Vector<int,_4>::operator==((Vector<int,_4> *)&local_58,(Vector<int,_4> *)&local_68)
    ;
    if (bVar2) {
LAB_00192b64:
      VVar9 = VK_BORDER_COLOR_INT_TRANSPARENT_BLACK;
      goto LAB_00192c18;
    }
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.4013e-45;
    bVar2 = tcu::Vector<int,_4>::operator==((Vector<int,_4> *)&local_58,(Vector<int,_4> *)&local_68)
    ;
    if (bVar2) {
LAB_00192bc4:
      VVar9 = VK_BORDER_COLOR_INT_OPAQUE_BLACK;
      goto LAB_00192c18;
    }
    local_68.m_data[0] = 1.4013e-45;
    local_68.m_data[1] = 1.4013e-45;
    local_68.m_data[2] = 1.4013e-45;
    local_68.m_data[3] = 1.4013e-45;
    bVar2 = tcu::Vector<int,_4>::operator==((Vector<int,_4> *)&local_58,(Vector<int,_4> *)&local_68)
    ;
LAB_00192be4:
    if (bVar2 != false) {
      VVar9 = VK_BORDER_COLOR_INT_OPAQUE_WHITE;
      goto LAB_00192c18;
    }
  }
  else {
    if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
      local_58.m_data._0_8_ = *(undefined8 *)&(sampler->borderColor).v;
      local_58.m_data._8_8_ = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      bVar2 = tcu::Vector<unsigned_int,_4>::operator==
                        ((Vector<unsigned_int,_4> *)&local_58,(Vector<unsigned_int,_4> *)&local_68);
      if (bVar2) goto LAB_00192b64;
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.4013e-45;
      bVar2 = tcu::Vector<unsigned_int,_4>::operator==
                        ((Vector<unsigned_int,_4> *)&local_58,(Vector<unsigned_int,_4> *)&local_68);
      if (bVar2) goto LAB_00192bc4;
      local_68.m_data[0] = 1.4013e-45;
      local_68.m_data[1] = 1.4013e-45;
      local_68.m_data[2] = 1.4013e-45;
      local_68.m_data[3] = 1.4013e-45;
      bVar2 = tcu::Vector<unsigned_int,_4>::operator==
                        ((Vector<unsigned_int,_4> *)&local_58,(Vector<unsigned_int,_4> *)&local_68);
      goto LAB_00192be4;
    }
    local_58.m_data._0_8_ = *(undefined8 *)&(sampler->borderColor).v;
    local_58.m_data._8_8_ = *(undefined8 *)((long)&(sampler->borderColor).v + 8);
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 0.0;
    bVar2 = tcu::Vector<float,_4>::operator==(&local_58,&local_68);
    VVar9 = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    if (bVar2) goto LAB_00192c18;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_68.m_data[2] = 0.0;
    local_68.m_data[3] = 1.0;
    bVar2 = tcu::Vector<float,_4>::operator==(&local_58,&local_68);
    if (bVar2) {
      VVar9 = VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK;
      goto LAB_00192c18;
    }
    local_68.m_data[0] = 1.0;
    local_68.m_data[1] = 1.0;
    local_68.m_data[2] = 1.0;
    local_68.m_data[3] = 1.0;
    bVar2 = tcu::Vector<float,_4>::operator==(&local_58,&local_68);
    if (bVar2) {
      VVar9 = VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
      goto LAB_00192c18;
    }
  }
  VVar9 = VK_BORDER_COLOR_LAST;
LAB_00192c18:
  FVar1 = sampler->minFilter;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  uVar7 = sampler->magFilter - LINEAR;
  VVar5 = VK_FILTER_NEAREST;
  VVar8 = VK_FILTER_NEAREST;
  if (uVar7 < 5) {
    VVar8 = *(VkFilter *)(&DAT_002286d4 + (ulong)uVar7 * 4);
  }
  __return_storage_ptr__->magFilter = VVar8;
  if (FVar1 - LINEAR < 5) {
    VVar5 = *(VkFilter *)(&DAT_002286d4 + (ulong)(FVar1 - LINEAR) * 4);
  }
  bVar2 = local_3c != COMPAREMODE_NONE;
  __return_storage_ptr__->minFilter = VVar5;
  __return_storage_ptr__->mipmapMode = (uint)((FVar1 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0);
  VVar6 = mapWrapMode(sampler->wrapS);
  __return_storage_ptr__->addressModeU = VVar6;
  VVar6 = mapWrapMode(sampler->wrapT);
  __return_storage_ptr__->addressModeV = VVar6;
  VVar6 = mapWrapMode(sampler->wrapR);
  __return_storage_ptr__->mipLodBias = 0.0;
  __return_storage_ptr__->anisotropyEnable = 0;
  __return_storage_ptr__->addressModeW = VVar6;
  __return_storage_ptr__->maxAnisotropy = 1.0;
  __return_storage_ptr__->compareEnable = (uint)bVar2;
  __return_storage_ptr__->compareOp = VVar3;
  if (FVar1 < NEAREST_MIPMAP_NEAREST) {
    local_38 = 0.0;
  }
  __return_storage_ptr__->minLod = local_38;
  if (FVar1 < NEAREST_MIPMAP_NEAREST) {
    local_34 = 0.25;
  }
  __return_storage_ptr__->maxLod = local_34;
  __return_storage_ptr__->borderColor = VVar9;
  __return_storage_ptr__->unnormalizedCoordinates = sampler->normalizedCoords ^ 1;
  return __return_storage_ptr__;
}

Assistant:

VkSamplerCreateInfo mapSampler (const tcu::Sampler& sampler, const tcu::TextureFormat& format, float minLod, float maxLod)
{
	const bool					compareEnabled	= (sampler.compare != tcu::Sampler::COMPAREMODE_NONE);
	const VkCompareOp			compareOp		= (compareEnabled) ? (mapCompareMode(sampler.compare)) : (VK_COMPARE_OP_ALWAYS);
	const VkBorderColor			borderColor		= mapBorderColor(getTextureChannelClass(format.type), sampler.borderColor);
	const bool					isMipmapEnabled	= (sampler.minFilter != tcu::Sampler::NEAREST && sampler.minFilter != tcu::Sampler::LINEAR);

	const VkSamplerCreateInfo	createInfo		=
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
		DE_NULL,
		(VkSamplerCreateFlags)0,
		mapFilterMode(sampler.magFilter),							// magFilter
		mapFilterMode(sampler.minFilter),							// minFilter
		mapMipmapMode(sampler.minFilter),							// mipMode
		mapWrapMode(sampler.wrapS),									// addressU
		mapWrapMode(sampler.wrapT),									// addressV
		mapWrapMode(sampler.wrapR),									// addressW
		0.0f,														// mipLodBias
		VK_FALSE,													// anisotropyEnable
		1.0f,														// maxAnisotropy
		(VkBool32)(compareEnabled ? VK_TRUE : VK_FALSE),			// compareEnable
		compareOp,													// compareOp
		(isMipmapEnabled ? minLod : 0.0f),							// minLod
		(isMipmapEnabled ? maxLod : 0.25f),							// maxLod
		borderColor,												// borderColor
		(VkBool32)(sampler.normalizedCoords ? VK_FALSE : VK_TRUE),	// unnormalizedCoords
	};

	return createInfo;
}